

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.h
# Opt level: O0

cmCommand * __thiscall cmAddCustomCommandCommand::Clone(cmAddCustomCommandCommand *this)

{
  cmCommand *this_00;
  cmAddCustomCommandCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmAddCustomCommandCommand((cmAddCustomCommandCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmAddCustomCommandCommand;
    }